

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

int dlep_extension_radio_write_session_init_ack
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  oonf_layer2_neighbor_index oVar1;
  oonf_layer2_network_index oVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uStack_b0;
  int result;
  size_t i;
  oonf_layer2_network_index net_idx;
  oonf_layer2_neighbor_index neigh_idx;
  oonf_layer2_data *l2data;
  oonf_layer2_net *l2net;
  oonf_layer2_metadata *meta;
  oonf_layer2_neigh_key *neigh_local;
  dlep_session *session_local;
  dlep_extension *ext_local;
  
  lVar3 = oonf_layer2_net_add((session->l2_listener).name);
  if (lVar3 == 0) {
    if (((&log_global_mask)[session->log_source] & 4) != 0) {
      oonf_log(4,session->log_source,"src/generic/dlep/dlep_extension.c",0x11f,0,0,
               "Could not add l2net for new interface");
    }
    ext_local._4_4_ = -1;
  }
  else {
    for (uStack_b0 = 0; uStack_b0 < ext->neigh_mapping_count; uStack_b0 = uStack_b0 + 1) {
      if ((ext->neigh_mapping[uStack_b0].mandatory & 1U) != 0) {
        oVar1 = ext->neigh_mapping[uStack_b0].layer2;
        lVar4 = lVar3 + 0x390 + (ulong)oVar1 * 0x28;
        bVar6 = false;
        if (*(long *)(lVar4 + 0x20) != 0) {
          bVar6 = *(long *)(lVar4 + 0x18) != 0;
        }
        if (!bVar6) {
          uVar5 = oonf_layer2_neigh_metadata_get(oVar1);
          oonf_layer2_data_set
                    (lVar4,session->l2_default_origin,uVar5,
                     &ext->neigh_mapping[uStack_b0].default_value);
        }
      }
    }
    for (uStack_b0 = 0; uStack_b0 < ext->if_mapping_count; uStack_b0 = uStack_b0 + 1) {
      if ((ext->if_mapping[uStack_b0].mandatory & 1U) != 0) {
        oVar2 = ext->if_mapping[uStack_b0].layer2;
        lVar4 = lVar3 + 0x110 + (ulong)oVar2 * 0x28;
        bVar6 = false;
        if (*(long *)(lVar4 + 0x20) != 0) {
          bVar6 = *(long *)(lVar4 + 0x18) != 0;
        }
        if (!bVar6) {
          uVar5 = oonf_layer2_net_metadata_get(oVar2);
          oonf_layer2_data_set
                    (lVar4,session->l2_default_origin,uVar5,
                     &ext->if_mapping[uStack_b0].default_value);
        }
      }
    }
    if (((&log_global_mask)[session->log_source] & 1) != 0) {
      oonf_log(1,session->log_source,"src/generic/dlep/dlep_extension.c",0x142,0,0,
               "Mapping default neighbor data (%s) to TLVs",lVar3);
    }
    ext_local._4_4_ =
         dlep_writer_map_l2neigh_data
                   (&session->writer,ext,(oonf_layer2_data *)(lVar3 + 0x390),(oonf_layer2_data *)0x0
                   );
    if (ext_local._4_4_ == 0) {
      if (((&log_global_mask)[session->log_source] & 1) != 0) {
        oonf_log(1,session->log_source,"src/generic/dlep/dlep_extension.c",0x14a,0,0,
                 "Mapping if data (%s) to TLVs",lVar3);
      }
      ext_local._4_4_ =
           dlep_writer_map_l2net_data(&session->writer,ext,(oonf_layer2_data *)(lVar3 + 0x110));
      if (ext_local._4_4_ == 0) {
        ext_local._4_4_ = 0;
      }
      else if (((&log_global_mask)[session->log_source] & 4) != 0) {
        oonf_log(4,session->log_source,"src/generic/dlep/dlep_extension.c",0x14d,0,0,
                 "tlv mapping for extension %d failed: %d",ext->id,ext_local._4_4_);
      }
    }
    else if (((&log_global_mask)[session->log_source] & 4) != 0) {
      oonf_log(4,session->log_source,"src/generic/dlep/dlep_extension.c",0x145,0,0,
               "tlv mapping for extension %d failed: %d",ext->id,ext_local._4_4_);
    }
  }
  return ext_local._4_4_;
}

Assistant:

int
dlep_extension_radio_write_session_init_ack(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh __attribute__((unused))) {
  const struct oonf_layer2_metadata *meta;
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_data *l2data;
  enum oonf_layer2_neighbor_index neigh_idx;
  enum oonf_layer2_network_index net_idx;
  size_t i;
  int result;

  /* first make sure defaults are set correctly */
  l2net = oonf_layer2_net_add(session->l2_listener.name);
  if (!l2net) {
    OONF_WARN(session->log_source, "Could not add l2net for new interface");
    return -1;
  }

  /* adding default neighbor data for mandatory values */
  for (i = 0; i < ext->neigh_mapping_count; i++) {
    if (!ext->neigh_mapping[i].mandatory) {
      continue;
    }

    neigh_idx = ext->neigh_mapping[i].layer2;
    l2data = &l2net->neighdata[neigh_idx];

    if (!oonf_layer2_data_has_value(l2data)) {
      meta = oonf_layer2_neigh_metadata_get(neigh_idx);
      oonf_layer2_data_set(l2data, session->l2_default_origin, meta, &ext->neigh_mapping[i].default_value);
    }
  }

  /* adding default interface data for mandatory values */
  for (i = 0; i < ext->if_mapping_count; i++) {
    if (!ext->if_mapping[i].mandatory) {
      continue;
    }

    net_idx = ext->if_mapping[i].layer2;
    l2data = &l2net->data[net_idx];

    if (!oonf_layer2_data_has_value(l2data)) {
      meta = oonf_layer2_net_metadata_get(net_idx);
      oonf_layer2_data_set(l2data, session->l2_default_origin, meta, &ext->if_mapping[i].default_value);
    }
  }

  /* write default metric values */
  OONF_DEBUG(session->log_source, "Mapping default neighbor data (%s) to TLVs", l2net->name);
  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2net->neighdata, NULL);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }

  /* write network wide data */
  OONF_DEBUG(session->log_source, "Mapping if data (%s) to TLVs", l2net->name);
  result = dlep_writer_map_l2net_data(&session->writer, ext, l2net->data);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }
  return 0;
}